

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillLeftConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  Fill(this,tcx,node->prev);
  if (((node->prev->point != edge->p) &&
      (OVar1 = Orient2d(edge->q,node->prev->point,edge->p), OVar1 == CW)) &&
     (OVar1 = Orient2d(node->point,node->prev->point,node->prev->prev->point), OVar1 == CW)) {
    FillLeftConcaveEdgeEvent(this,tcx,edge,node);
  }
  return;
}

Assistant:

void Sweep::FillLeftConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.prev);
  if (node.prev->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->point, *edge->p) == CW) {
      // Below
      if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
        // Next is concave
        FillLeftConcaveEdgeEvent(tcx, edge, node);
      } else{
        // Next is convex
      }
    }
  }

}